

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundfiles.c
# Opt level: O3

int ps_config_wavfile(ps_config_t *config,FILE *infh,char *file)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *__ptr;
  char *fmt;
  long lVar5;
  char *pcVar6;
  size_t __size;
  undefined8 uVar7;
  ulong __size_00;
  int16 shortval;
  int32 intval;
  char id [4];
  short local_3a;
  uint local_38;
  int local_34;
  
  pcVar6 = "(input filehandle)";
  if (file != (char *)0x0) {
    pcVar6 = file;
  }
  ps_config_set_str(config,"input_endian","little");
  sVar4 = fread(&local_34,1,4,(FILE *)infh);
  if (sVar4 == 4) {
    sVar4 = fread(&local_38,4,1,(FILE *)infh);
    if (sVar4 == 1) {
      sVar4 = fread(&local_34,1,4,(FILE *)infh);
      if (sVar4 == 4) {
        if (local_34 != 0x45564157) {
          fmt = "%s is not a WAVE file\n";
          lVar5 = 0x78;
          goto LAB_0010db1d;
        }
        sVar4 = fread(&local_34,1,4,(FILE *)infh);
        if (sVar4 == 4) {
          if (local_34 != 0x20746d66) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                    ,0x7f,"Format chunk missing\n");
            return -1;
          }
          sVar4 = fread(&local_38,4,1,(FILE *)infh);
          uVar1 = local_38;
          if (sVar4 == 1) {
            sVar4 = fread(&local_3a,2,1,(FILE *)infh);
            if (sVar4 == 1) {
              if (local_3a != 1) {
                fmt = "%s is not in PCM format\n";
                lVar5 = 0x8c;
LAB_0010db1d:
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                        ,lVar5,fmt,pcVar6);
                return -1;
              }
              sVar4 = fread(&local_3a,2,1,(FILE *)infh);
              if (sVar4 == 1) {
                if (local_3a != 1) {
                  fmt = "%s is not single channel\n";
                  lVar5 = 0x95;
                  goto LAB_0010db1d;
                }
                sVar4 = fread(&local_38,4,1,(FILE *)infh);
                if (sVar4 == 1) {
                  lVar5 = ps_config_int(config,"samprate");
                  if (lVar5 == 0) {
                    ps_config_set_int(config,"samprate",(long)(int)local_38);
                  }
                  else {
                    lVar5 = ps_config_int(config,"samprate");
                    uVar2 = local_38;
                    if (lVar5 != (int)local_38) {
                      lVar5 = ps_config_int(config,"samprate");
                      err_msg(ERR_WARN,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                              ,0xa1,"WAVE file sampling rate %d != samprate %d\n",(ulong)uVar2,lVar5
                             );
                    }
                  }
                  sVar4 = fread(&local_38,4,1,(FILE *)infh);
                  if (sVar4 == 1) {
                    sVar4 = fread(&local_3a,2,1,(FILE *)infh);
                    if (sVar4 == 1) {
                      sVar4 = fread(&local_3a,2,1,(FILE *)infh);
                      if (sVar4 == 1) {
                        if (local_3a != 0x10) {
                          fmt = "%s is not 16-bit\n";
                          lVar5 = 0xae;
                          goto LAB_0010db1d;
                        }
                        if (0x10 < (int)uVar1) {
                          __size_00 = (ulong)(uVar1 - 0x10);
                          __ptr = malloc(__size_00);
                          sVar4 = fread(__ptr,1,__size_00,(FILE *)infh);
                          if (sVar4 != __size_00) {
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                           ,0xb8,"%s: Failed to read extra header",pcVar6);
LAB_0010e009:
                            ckd_free(__ptr);
                            return -1;
                          }
                          ckd_free(__ptr);
                        }
                        sVar4 = fread(&local_34,1,4,(FILE *)infh);
                        if (sVar4 == 4) {
                          do {
                            iVar3 = local_34;
                            sVar4 = fread(&local_38,4,1,(FILE *)infh);
                            if (iVar3 == 0x61746164) {
                              if (sVar4 == 1) {
                                return 0;
                              }
                              lVar5 = 0xc5;
                              goto LAB_0010db6b;
                            }
                            if (sVar4 != 1) {
                              lVar5 = 0xcc;
                              goto LAB_0010db6b;
                            }
                            __size = (size_t)(int)local_38;
                            __ptr = malloc(__size);
                            sVar4 = fread(__ptr,1,__size,(FILE *)infh);
                            if (sVar4 != __size) {
                              err_msg_system(ERR_ERROR,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                             ,0xd1,"%s: Failed to read %s chunk",pcVar6,&local_34);
                              goto LAB_0010e009;
                            }
                            ckd_free(__ptr);
                            sVar4 = fread(&local_34,1,4,(FILE *)infh);
                          } while (sVar4 == 4);
                        }
                        lVar5 = 0xc2;
                        goto LAB_0010db6b;
                      }
                      lVar5 = 0xab;
                    }
                    else {
                      lVar5 = 0xa8;
                    }
                    goto LAB_0010dd2b;
                  }
                  lVar5 = 0xa5;
                }
                else {
                  lVar5 = 0x9b;
                }
                goto LAB_0010db6b;
              }
              lVar5 = 0x92;
            }
            else {
              lVar5 = 0x89;
            }
LAB_0010dd2b:
            uVar7 = 2;
            goto LAB_0010db76;
          }
          lVar5 = 0x84;
        }
        else {
          lVar5 = 0x7d;
        }
      }
      else {
        lVar5 = 0x76;
      }
    }
    else {
      lVar5 = 0x74;
    }
  }
  else {
    lVar5 = 0x72;
  }
LAB_0010db6b:
  uVar7 = 4;
LAB_0010db76:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                 ,lVar5,"Failed to read %d bytes",uVar7);
  return -1;
}

Assistant:

int
ps_config_wavfile(ps_config_t *config, FILE *infh, const char *file)
{
    char id[4];
    int32 intval, header_len;
    int16 shortval;
    int rv = 0;

    if (file == NULL)
        file = "(input filehandle)";
        
    /* RIFF files are little-endian by definition. */
    ps_config_set_str(config, "input_endian", "little");

    /* Read in all the header chunks and etcetera. */
    TRY_FREAD(id, 1, 4, infh);
    /* Total file length (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);
    /* 'WAVE' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "WAVE", 4)) {
        E_ERROR("%s is not a WAVE file\n", file);
        rv = -1;
        goto error_out;
    }
    /* 'fmt ' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "fmt ", 4)) {
        E_ERROR("Format chunk missing\n");
        rv = -1;
        goto error_out;
    }
    /* Length of 'fmt ' chunk */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    header_len = intval;

    /* Data format. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not in PCM format\n", file);
        rv = -1;
        goto error_out;
    }

    /* Number of channels. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not single channel\n", file);
        rv = -1;
        goto error_out;
    }

    /* Sampling rate (finally!) */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    if (ps_config_int(config, "samprate") == 0)
        ps_config_set_int(config, "samprate", intval);
    else if (ps_config_int(config, "samprate") != intval) {
        E_WARN("WAVE file sampling rate %d != samprate %d\n",
               intval, ps_config_int(config, "samprate"));
    }

    /* Average bytes per second (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);

    /* Block alignment (we don't care) */
    TRY_FREAD(&shortval, 2, 1, infh);

    /* Bits per sample (must be 16) */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 16) {
        E_ERROR("%s is not 16-bit\n", file);
        rv = -1;
        goto error_out;
    }

    /* Any extra parameters. */
    if (header_len > 16) {
        /* Avoid seeking... */
        char *spam = malloc(header_len - 16);
        if (fread(spam, 1, header_len - 16, infh) != (size_t)(header_len - 16)) {
            E_ERROR_SYSTEM("%s: Failed to read extra header", file);
            rv = -1;
        }
        ckd_free(spam);
        if (rv == -1)
            goto error_out;
    }

    /* Now skip to the 'data' chunk. */
    while (1) {
        TRY_FREAD(id, 1, 4, infh);
        if (0 == memcmp(id, "data", 4)) {
            /* Total number of bytes of data (we don't care). */
            TRY_FREAD(&intval, 4, 1, infh);
            break;
        }
        else {
            char *spam;
            /* Some other stuff... */
            /* Number of bytes of ... whatever */
            TRY_FREAD(&intval, 4, 1, infh);
            SWAP_LE_32(&intval);
            /* Avoid seeking... */
            spam = malloc(intval);
            if (fread(spam, 1, intval, infh) != (size_t)intval) {
                E_ERROR_SYSTEM("%s: Failed to read %s chunk", file, id);
                rv = -1;
            }
            ckd_free(spam);
            if (rv == -1)
                goto error_out;
        }
    }

error_out:
    return rv;
}